

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O3

int32 str2words(char *line,char **ptr,int32 max_ptr)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  lVar1 = 0;
  iVar3 = 0;
LAB_00107dd4:
  uVar5 = (ulong)iVar3;
  pbVar4 = (byte *)(line + uVar5);
  while( true ) {
    iVar3 = iVar3 + 1;
    uVar6 = (ulong)(byte)line[uVar5];
    if (0x20 < uVar6) break;
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0) goto LAB_00107e6f;
      break;
    }
    uVar5 = uVar5 + 1;
    pbVar4 = pbVar4 + 1;
  }
  if (max_ptr <= lVar1 && ptr != (char **)0x0) {
    lVar1 = 0xffffffff;
    if (-1 < (long)uVar5) {
      iVar3 = (int)uVar5 + 1;
      pcVar2 = line + (uVar5 & 0xffffffff);
      do {
        if (*pcVar2 == '\0') {
          *pcVar2 = ' ';
        }
        iVar3 = iVar3 + -1;
        pcVar2 = pcVar2 + -1;
      } while (0 < iVar3);
    }
LAB_00107e6f:
    return (int32)lVar1;
  }
  if (ptr != (char **)0x0) {
    ptr[lVar1] = line + uVar5;
  }
  lVar1 = lVar1 + 1;
  do {
    uVar5 = (ulong)*pbVar4;
    if (uVar5 < 0x21) {
      if ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0) break;
      if (uVar5 == 0) goto LAB_00107e6f;
    }
    pbVar4 = pbVar4 + 1;
    iVar3 = iVar3 + 1;
  } while( true );
  if (ptr != (char **)0x0) {
    *pbVar4 = 0;
  }
  goto LAB_00107dd4;
}

Assistant:

int32
str2words(char *line, char **ptr, int32 max_ptr)
{
    int32 i, n;

    n = 0;                      /* #words found so far */
    i = 0;                      /* For scanning through the input string */
    while (1) {
        /* Skip whitespace before next word */
        while (line[i] && isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;

        if (ptr != NULL && n >= max_ptr) {
            /*
             * Pointer array size insufficient.  Restore NULL chars inserted so far
             * to space chars.  Not a perfect restoration, but better than nothing.
             */
            for (; i >= 0; --i)
                if (line[i] == '\0')
                    line[i] = ' ';

            return -1;
        }

        /* Scan to end of word */
        if (ptr != NULL)
            ptr[n] = line + i;
        ++n;
        while (line[i] && !isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;
        if (ptr != NULL)
            line[i] = '\0';
        ++i;
    }

    return n;
}